

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

bool QObject::disconnect(QObject *sender,char *signal,QObject *receiver,char *method)

{
  QArgumentType *pQVar1;
  QMetaObject *pQVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  QMetaObjectPrivate *this;
  QArgumentType *in_R9;
  char *pcVar10;
  byte *signature;
  byte *signature_00;
  QArrayData *data;
  long in_FS_OFFSET;
  QByteArrayView name;
  QByteArrayView name_00;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QMetaObject *smeta;
  QArrayData *local_350;
  storage_type *local_330;
  QMetaObject **local_328;
  QMetaObject *local_310;
  QMetaObject *local_2f0;
  undefined1 local_2e8 [344];
  undefined1 local_190 [344];
  long local_38;
  undefined4 extraout_var_00;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sender == (QObject *)0x0) || (method != (char *)0x0 && receiver == (QObject *)0x0)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      disconnect();
    }
    bVar4 = false;
    goto LAB_002b35b8;
  }
  if (signal == (char *)0x0) {
    data = (QArrayData *)0x0;
    signature = (byte *)0x0;
LAB_002b3653:
    if (method == (char *)0x0) {
      local_350 = (QArrayData *)0x0;
      signature_00 = (byte *)0x0;
LAB_002b36cb:
      iVar7 = (**sender->_vptr_QObject)();
      local_2f0 = (QMetaObject *)CONCAT44(extraout_var,iVar7);
      pQVar1 = (QArgumentType *)(local_190 + 0x18);
      memset(pQVar1,0xaa,0x140);
      local_190._0_8_ = (QArrayData *)0xa;
      local_190._8_8_ = (byte *)0x0;
      local_190._16_8_ = pQVar1;
      if (signature == (byte *)0x0) {
        QVar11 = (QByteArrayView)ZEXT816(0);
      }
      else {
        QVar11 = QMetaObjectPrivate::decodeMethodSignature
                           ((char *)signature,(QArgumentTypeArray *)local_190);
      }
      pQVar1 = (QArgumentType *)(local_2e8 + 0x18);
      memset(pQVar1,0xaa,0x140);
      local_2e8._0_8_ = 10;
      local_2e8._8_8_ = 0;
      local_2e8._16_8_ = pQVar1;
      if (signature_00 == (byte *)0x0) {
        QVar12 = (QByteArrayView)ZEXT816(0);
      }
      else {
        QVar12 = QMetaObjectPrivate::decodeMethodSignature
                           ((char *)signature_00,(QArgumentTypeArray *)local_2e8);
      }
      local_310 = (QMetaObject *)QVar12.m_size;
      bVar4 = false;
      bVar3 = 0;
      bVar5 = false;
      do {
        local_330 = QVar11.m_data;
        local_328 = (QMetaObject **)QVar11.m_size;
        if (signature == (byte *)0x0) {
          iVar7 = -1;
        }
        else {
          name.m_data._0_4_ = local_190._8_4_;
          name.m_size = (qsizetype)local_330;
          name.m_data._4_4_ = 0;
          iVar7 = QMetaObjectPrivate::indexOfSignalRelative
                            ((QMetaObjectPrivate *)&local_2f0,local_328,name,(int)local_190._16_8_,
                             in_R9);
          if (iVar7 < 0) break;
          iVar8 = QMetaObjectPrivate::originalClone(local_2f0,iVar7);
          iVar7 = 0;
          for (pQVar2 = (local_2f0->d).superdata.direct; pQVar2 != (QMetaObject *)0x0;
              pQVar2 = (pQVar2->d).superdata.direct) {
            iVar7 = iVar7 + (pQVar2->d).data[0xd];
          }
          iVar7 = iVar7 + iVar8;
          bVar5 = true;
        }
        if (signature_00 == (byte *)0x0) {
          in_R9 = (QArgumentType *)0x0;
          bVar6 = QMetaObjectPrivate::disconnect
                            (sender,iVar7,local_2f0,receiver,-1,(void **)0x0,DisconnectAll);
          bVar4 = (bool)(bVar4 | bVar6);
        }
        else {
          iVar8 = (**receiver->_vptr_QObject)(receiver);
          this = (QMetaObjectPrivate *)CONCAT44(extraout_var_00,iVar8);
          do {
            name_00.m_data._0_4_ = local_2e8._8_4_;
            name_00.m_size = (qsizetype)QVar12.m_data;
            name_00.m_data._4_4_ = 0;
            iVar8 = QMetaObjectPrivate::indexOfMethod
                              (this,local_310,name_00,(int)local_2e8._16_8_,in_R9);
            if (iVar8 < 0) break;
            while (iVar9 = QMetaObject::methodOffset((QMetaObject *)this), iVar8 < iVar9) {
              this = *(QMetaObjectPrivate **)this;
            }
            in_R9 = (QArgumentType *)0x0;
            bVar6 = QMetaObjectPrivate::disconnect
                              (sender,iVar7,local_2f0,receiver,iVar8,(void **)0x0,DisconnectAll);
            bVar4 = (bool)(bVar4 | bVar6);
            this = *(QMetaObjectPrivate **)this;
            bVar3 = 1;
          } while (this != (QMetaObjectPrivate *)0x0);
        }
        if (signature == (byte *)0x0) goto LAB_002b3947;
        local_2f0 = (local_2f0->d).superdata.direct;
      } while (local_2f0 != (QMetaObject *)0x0);
      if (bVar5) {
LAB_002b3947:
        if (!(bool)(signature_00 == (byte *)0x0 | bVar3)) {
          err_method_notfound(receiver,method,"disconnect");
          err_info_about_objects("disconnect",sender,receiver);
        }
        if ((signature == (byte *)0x0) && (bVar4 != false)) {
          (*sender->_vptr_QObject[0xb])();
          bVar4 = true;
        }
      }
      else {
        err_method_notfound(sender,signal,"disconnect");
        err_info_about_objects("disconnect",sender,receiver);
      }
      std::_Destroy_n_aux<false>::__destroy_n<QArgumentType*,long_long>
                ((QArgumentType *)local_2e8._16_8_,local_2e8._8_8_);
      if ((QArgumentType *)local_2e8._16_8_ != (QArgumentType *)(local_2e8 + 0x18)) {
        QtPrivate::sizedFree((void *)local_2e8._16_8_,local_2e8._0_8_ << 5);
      }
      std::_Destroy_n_aux<false>::__destroy_n<QArgumentType*,long_long>
                ((QArgumentType *)local_190._16_8_,local_190._8_8_);
      if ((QArgumentType *)local_190._16_8_ != (QArgumentType *)(local_190 + 0x18)) {
        QtPrivate::sizedFree((void *)local_190._16_8_,local_190._0_8_ << 5);
      }
    }
    else {
      QMetaObject::normalizedSignature((QByteArray *)local_190,method);
      pcVar10 = (char *)local_190._8_8_;
      if ((byte *)local_190._8_8_ == (byte *)0x0) {
        pcVar10 = &QByteArray::_empty;
      }
      local_350 = (QArrayData *)local_190._0_8_;
      bVar4 = check_method_code((byte)*pcVar10 & 3,receiver,pcVar10,"disconnect");
      if (bVar4) {
        signature_00 = (byte *)pcVar10 + 1;
        goto LAB_002b36cb;
      }
      bVar4 = false;
    }
    if (local_350 != (QArrayData *)0x0) {
      LOCK();
      (local_350->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_350->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_350->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_350,1,0x10);
      }
    }
  }
  else {
    QMetaObject::normalizedSignature((QByteArray *)local_190,signal);
    data = (QArrayData *)local_190._0_8_;
    pcVar10 = (char *)local_190._8_8_;
    if ((byte *)local_190._8_8_ == (byte *)0x0) {
      pcVar10 = &QByteArray::_empty;
    }
    bVar4 = check_signal_macro(sender,pcVar10,"disconnect","unbind");
    if (bVar4) {
      signature = (byte *)pcVar10 + 1;
      goto LAB_002b3653;
    }
    bVar4 = false;
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
LAB_002b35b8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QObject::disconnect(const QObject *sender, const char *signal,
                         const QObject *receiver, const char *method)
{
    if (sender == nullptr || (receiver == nullptr && method != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }

    const char *signal_arg = signal;
    QByteArray signal_name;
    bool signal_found = false;
    if (signal) {
        QT_TRY {
            signal_name = QMetaObject::normalizedSignature(signal);
            signal = signal_name.constData();
        } QT_CATCH (const std::bad_alloc &) {
            // if the signal is already normalized, we can continue.
            if (sender->metaObject()->indexOfSignal(signal + 1) == -1)
                QT_RETHROW;
        }

        if (!check_signal_macro(sender, signal, "disconnect", "unbind"))
            return false;
        signal++; // skip code
    }